

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O2

int adiak_clustername(void)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *outbuffer;
  char clustername [512];
  char hostname [512];
  
  outbuffer = hostname;
  iVar3 = 0;
  memset(outbuffer,0,0x200);
  memset(clustername,0,0x200);
  iVar2 = adksys_hostname(outbuffer,0x200);
  if (iVar2 == -1) {
    iVar3 = -1;
  }
  else {
    while( true ) {
      cVar1 = *outbuffer;
      if (cVar1 == '\0') break;
      if (9 < (byte)(cVar1 - 0x30U)) {
        if (cVar1 == '.') break;
        clustername[iVar3] = cVar1;
        iVar3 = iVar3 + 1;
      }
      outbuffer = outbuffer + 1;
    }
    clustername[iVar3] = '\0';
    iVar3 = adiak_namevalue("cluster",2,"host","%s",clustername);
  }
  return iVar3;
}

Assistant:

int adiak_clustername()
{
   char hostname[512];
   char clustername[512];
   int result;
   int i = 0;
   char *c;

   memset(hostname, 0, sizeof(hostname));
   memset(clustername, 0, sizeof(hostname));
   result = adksys_hostname(hostname, sizeof(hostname));
   if (result == -1)
      return -1;

   for (c = hostname; *c; c++) {
      if (*c >= '0' && *c <= '9')
         continue;
      if (*c == '.')
         break;
      clustername[i++] = *c;
   }
   clustername[i] = '\0';

   return adiak_namevalue("cluster", adiak_general, "host", "%s", clustername);
}